

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

void __thiscall UniValue::pushKV(UniValue *this,string key,UniValue val)

{
  long lVar1;
  string key_00;
  bool bVar2;
  UniValue *in_RDX;
  string *in_RSI;
  long in_FS_OFFSET;
  size_t idx;
  VType VVar3;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff60 [24];
  UniValue in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  VVar3 = VOBJ;
  checkType(this,(VType *)&stack0xffffffffffffff58);
  bVar2 = findKey(this,in_RSI,(size_t *)&stack0xffffffffffffff58);
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      operator=((this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start + CONCAT44(in_stack_ffffffffffffff5c,VVar3),in_RDX)
      ;
      return;
    }
  }
  else {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,in_RSI);
    UniValue((UniValue *)&stack0xffffffffffffff60,in_RDX);
    key_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff5c;
    key_00._M_dataplus._M_p._0_4_ = VVar3;
    key_00._M_string_length = in_stack_ffffffffffffff60._0_8_;
    key_00.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_ffffffffffffff60._8_16_;
    pushKVEnd(this,key_00,in_stack_ffffffffffffff78);
    ~UniValue((UniValue *)&stack0xffffffffffffff60);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::pushKV(std::string key, UniValue val)
{
    checkType(VOBJ);

    size_t idx;
    if (findKey(key, idx))
        values[idx] = std::move(val);
    else
        pushKVEnd(std::move(key), std::move(val));
}